

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O2

bool __thiscall Options::push_expect_var(Options *this,string_view *info)

{
  char *pcVar1;
  uint *__args_1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  optional<uint32_t> index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  optional<unsigned_int> local_38;
  
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  index.super_OptionalBase<unsigned_int>.init_ = false;
  index.super_OptionalBase<unsigned_int>.storage_.dummy_ = '\0';
  pcVar1 = info->__data;
  pcVar7 = pcVar1;
  do {
    pcVar1 = pcVar1 + info->__size;
    if (pcVar7 == pcVar1) {
LAB_001c4aba:
      if (index.super_OptionalBase<unsigned_int>.init_ == true) {
        __args_1 = std::experimental::optional<unsigned_int>::operator*(&index);
        bVar3 = true;
        std::
        vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
        ::
        emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int&>
                  ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
                    *)&this->expect_vars,&names,__args_1);
      }
      else {
LAB_001c4b27:
        bVar3 = false;
      }
LAB_001c4b29:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names);
      return bVar3;
    }
    lVar4 = 0;
    lVar2 = 0;
    for (lVar5 = (long)pcVar1 - (long)pcVar7 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
      if ((pcVar7[lVar4 * 4] == ',') || (pcVar7[lVar4 * 4] == ':')) {
        pcVar6 = pcVar7 + -lVar2;
        goto LAB_001c49bd;
      }
      if ((pcVar7[lVar4 * 4 + 1] == ',') || (pcVar7[lVar4 * 4 + 1] == ':')) {
        pcVar6 = pcVar7 + (1 - lVar2);
        goto LAB_001c49bd;
      }
      if ((pcVar7[lVar4 * 4 + 2] == ',') || (pcVar7[lVar4 * 4 + 2] == ':')) {
        pcVar6 = pcVar7 + (2 - lVar2);
        goto LAB_001c49bd;
      }
      if ((pcVar7[lVar4 * 4 + 3] == ',') || (pcVar7[lVar4 * 4 + 3] == ':')) {
        pcVar6 = pcVar7 + (3 - lVar2);
        goto LAB_001c49bd;
      }
      lVar2 = lVar2 + -4;
      lVar4 = lVar4 + 1;
    }
    pcVar6 = pcVar7 + -lVar2;
    lVar5 = ((long)pcVar1 - (long)pcVar7) + lVar2;
    if (lVar5 == 1) {
LAB_001c4a58:
      if ((*pcVar6 != ',') && (*pcVar6 != ':')) goto LAB_001c4b27;
    }
    else if (lVar5 == 3) {
      if ((pcVar7[lVar4 * 4] != ',') && (pcVar7[lVar4 * 4] != ':')) {
        pcVar6 = pcVar7 + (1 - lVar2);
        goto LAB_001c4a3e;
      }
    }
    else {
      if (lVar5 != 2) goto LAB_001c4b27;
LAB_001c4a3e:
      if ((*pcVar6 != ',') && (*pcVar6 != ':')) {
        pcVar6 = pcVar6 + 1;
        goto LAB_001c4a58;
      }
    }
LAB_001c49bd:
    bVar3 = false;
    if ((pcVar6 == pcVar1) || (bVar3 = false, pcVar7 == pcVar6)) goto LAB_001c4b29;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar7,pcVar6);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&names,&local_78
              );
    std::__cxx11::string::~string((string *)&local_78);
    if (*pcVar6 == ':') {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,pcVar6 + 1,info->__data + info->__size);
      local_38.super_OptionalBase<unsigned_int>.storage_.value_ =
           std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
      local_38.super_OptionalBase<unsigned_int>.init_ = true;
      std::experimental::optional<unsigned_int>::operator=(&index,&local_38);
      std::__cxx11::string::~string((string *)&local_78);
      goto LAB_001c4aba;
    }
    pcVar7 = pcVar6 + 1;
    pcVar1 = info->__data;
  } while( true );
}

Assistant:

bool Options::push_expect_var(const string_view& info)
{
    std::vector<std::string> names;
    optional<uint32_t> index;

    try
    {
        for(auto it = info.begin(); it != info.end(); )
        {
            auto beg_name = it;
            auto end_name = std::find_if(beg_name, info.end(), [](char c) { return c == ',' || c == ':'; });

            if(end_name == info.end() || beg_name == end_name)
                return false;

            names.emplace_back(std::string(beg_name, end_name));
            if(*end_name == ':')
            {
                index = std::stoi(std::string(end_name+1, info.end()));
                break;
            }

            it = std::next(end_name);
        }
    }
    catch(const std::logic_error&)
    {
        return false;
    }

    if(index)
    {
        this->expect_vars.emplace_back(std::move(names), *index);
        return true;
    }

    return false;
}